

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O2

void sysbvm_stackFrame_iterateGCRootsInRecordWith
               (sysbvm_stackFrameRecord_t *record,void *userdata,
               sysbvm_GCRootIterationFunction_t *iterationFunction)

{
  long lVar1;
  size_t i;
  sysbvm_stackFrameRecord_s *psVar2;
  ulong uVar3;
  long lVar4;
  sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *functionRecord;
  long lVar5;
  sysbvm_stackFrameRecord_t *psVar6;
  sysbvm_stackFrameRecordType_t *psVar7;
  long lVar8;
  
  lVar5 = 0x10;
  switch(record->type) {
  case SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS:
    lVar5 = 0;
    for (psVar2 = (sysbvm_stackFrameRecord_s *)0x0; psVar2 < record[1].previous;
        psVar2 = (sysbvm_stackFrameRecord_s *)((long)&psVar2->previous + 1)) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(*(long *)&record[1].type + lVar5));
      lVar5 = lVar5 + 8;
    }
    return;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
    lVar8 = 0x20;
    lVar4 = 0x18;
    lVar1 = lVar5;
    lVar5 = 0x28;
    break;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[1].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 2));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[2].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 3));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[3].type);
    lVar5 = 0;
    for (psVar2 = (sysbvm_stackFrameRecord_s *)0x0; psVar2 < record[4].previous;
        psVar2 = (sysbvm_stackFrameRecord_s *)((long)&psVar2->previous + 1)) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(*(long *)&record[4].type + lVar5));
      lVar5 = lVar5 + 8;
    }
    lVar5 = 0;
    for (psVar2 = (sysbvm_stackFrameRecord_s *)0x0; psVar2 < record[5].previous;
        psVar2 = (sysbvm_stackFrameRecord_s *)((long)&psVar2->previous + 1)) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)(*(long *)&record[5].type + lVar5));
      lVar5 = lVar5 + 8;
    }
    for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 8) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record[6].previous + lVar5));
    }
    lVar5 = 0x260;
    goto switchD_0013bd77_caseD_4;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 2));
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)&record[2].type);
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 3));
    lVar5 = 0;
    for (uVar3 = 0; uVar3 < *(ulong *)&record[3].type; uVar3 = uVar3 + 1) {
      (*iterationFunction)
                (userdata,(sysbvm_tuple_t *)((long)&(record[4].previous)->previous + lVar5));
      lVar5 = lVar5 + 8;
    }
    psVar6 = record + 5;
    for (uVar3 = 0; uVar3 < *(ulong *)&record[4].type; uVar3 = uVar3 + 1) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)psVar6);
      psVar6 = (sysbvm_stackFrameRecord_t *)&psVar6->type;
    }
    psVar7 = &record[0xd].type;
    for (psVar2 = (sysbvm_stackFrameRecord_s *)0x0; psVar2 < record[0xd].previous;
        psVar2 = (sysbvm_stackFrameRecord_s *)((long)&psVar2->previous + 1)) {
      (*iterationFunction)(userdata,(sysbvm_tuple_t *)psVar7);
      psVar7 = psVar7 + 2;
    }
    return;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
  case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
  case SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION:
  case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
    goto switchD_0013bd77_caseD_4;
  case SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD:
    (*iterationFunction)(userdata,(sysbvm_tuple_t *)(record + 1));
    lVar8 = 0x28;
    lVar4 = 0x20;
    lVar1 = 0x18;
    lVar5 = 0x30;
    break;
  default:
    abort();
  }
  (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record->previous + lVar1));
  (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record->previous + lVar4));
  (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record->previous + lVar8));
switchD_0013bd77_caseD_4:
  (*iterationFunction)(userdata,(sysbvm_tuple_t *)((long)&record->previous + lVar5));
  return;
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_iterateGCRootsInRecordWith(sysbvm_stackFrameRecord_t *record, void *userdata, sysbvm_GCRootIterationFunction_t iterationFunction)
{
    switch(record->type)
    {
    case SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS:
        {
            sysbvm_stackFrameGCRootsRecord_t *rootRecord = (sysbvm_stackFrameGCRootsRecord_t*)record;
            for(size_t i = 0; i < rootRecord->rootCount; ++i)
                iterationFunction(userdata, &rootRecord->roots[i]);
        }
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameFunctionActivationRecord_t *functionRecord = (sysbvm_stackFrameFunctionActivationRecord_t*)record;
            iterationFunction(userdata, &functionRecord->function);
            iterationFunction(userdata, &functionRecord->functionDefinition);
            iterationFunction(userdata, &functionRecord->applicationEnvironment);
            iterationFunction(userdata, &functionRecord->result);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameBytecodeFunctionActivationRecord_t *functionRecord = (sysbvm_stackFrameBytecodeFunctionActivationRecord_t*)record;
            iterationFunction(userdata, &functionRecord->function);
            iterationFunction(userdata, &functionRecord->functionDefinition);
            iterationFunction(userdata, &functionRecord->functionBytecode);

            iterationFunction(userdata, &functionRecord->captureVector);
            iterationFunction(userdata, &functionRecord->literalVector);
            iterationFunction(userdata, &functionRecord->instructions);

            for(size_t i = 0; i < functionRecord->argumentCount; ++i)
                iterationFunction(userdata, functionRecord->arguments + i);

            for(size_t i = 0; i < functionRecord->inlineLocalVectorSize; ++i)
                iterationFunction(userdata, functionRecord->inlineLocalVector + i);

            for(size_t i = 0; i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE; ++i)
                iterationFunction(userdata, functionRecord->operandRegisterFile + i);

            iterationFunction(userdata, &functionRecord->result);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION:
        {
            sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *functionRecord = (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t*)record;

            iterationFunction(userdata, &functionRecord->literalVector);
            iterationFunction(userdata, &functionRecord->captureVector);
            iterationFunction(userdata, &functionRecord->function);

            for(size_t i = 0; i < functionRecord->argumentCount; ++i)
                iterationFunction(userdata, functionRecord->arguments + i);

            for(size_t i = 0; i < functionRecord->callArgumentVectorSize; ++i)
                iterationFunction(userdata, functionRecord->callArgumentVector + i);

            for(size_t i = 0; i < functionRecord->inlineLocalVectorSize; ++i)
                iterationFunction(userdata, functionRecord->inlineLocalVector + i);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET:
        {
            sysbvm_stackFrameBreakTargetRecord_t *breakRecord = (sysbvm_stackFrameBreakTargetRecord_t*)record;
            iterationFunction(userdata, &breakRecord->environment);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET:
        {
            sysbvm_stackFrameContinueTargetRecord_t *continueRecord = (sysbvm_stackFrameContinueTargetRecord_t*)record;
            iterationFunction(userdata, &continueRecord->environment);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION:
        {
            sysbvm_stackFrameSourcePositionRecord_t *sourcePositionRecord = (sysbvm_stackFrameSourcePositionRecord_t*)record;
            iterationFunction(userdata, &sourcePositionRecord->sourcePosition);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD:
        {
            sysbvm_stackFrameLandingPadRecord_t *landingPadRecord = (sysbvm_stackFrameLandingPadRecord_t*)record;
            iterationFunction(userdata, &landingPadRecord->exceptionFilter);
            iterationFunction(userdata, &landingPadRecord->stackTrace);
            iterationFunction(userdata, &landingPadRecord->exception);
            iterationFunction(userdata, &landingPadRecord->action);
            iterationFunction(userdata, &landingPadRecord->actionResult);
        }   
        break;
    case SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP:
        {
            sysbvm_stackFrameCleanupRecord_t *cleanupRecord = (sysbvm_stackFrameCleanupRecord_t*)record;
            iterationFunction(userdata, &cleanupRecord->action);
        }   
        break;
    default:
        // Should not reach here.
        abort();
        break;
    }
}